

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::splicePumpLoop
          (AsyncStreamFd *this,AsyncStreamFd *input,int pipeIn,int pipeOut,uint64_t readSoFar,
          uint64_t limit,size_t bufferedAmount)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined4 in_register_00000014;
  Disposer *in_stack_00000010;
  undefined1 local_1a0 [16];
  Fault f_4;
  SyscallResult local_164;
  undefined1 auStack_160 [4];
  SyscallResult _kjSyscallResult_1;
  ssize_t n_1;
  Fault f_3;
  undefined1 local_148 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_2;
  undefined1 local_f0 [16];
  Fault f_2;
  PromiseFulfiller<void> *local_d8;
  undefined1 local_d0 [8];
  DebugComparison<long_&,_int> _kjCondition_1;
  Fault f_1;
  undefined1 local_98 [8];
  DebugComparison<long_&,_unsigned_long_&> _kjCondition;
  Fault local_60;
  Fault f;
  SyscallResult local_3c;
  undefined1 auStack_38 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  uint64_t readSoFar_local;
  int pipeOut_local;
  int pipeIn_local;
  AsyncStreamFd *input_local;
  AsyncStreamFd *this_local;
  
  _pipeOut_local = (char *)CONCAT44(in_register_00000014,pipeIn);
  readSoFar_local._0_4_ = (undefined4)readSoFar;
  n = limit;
  readSoFar_local._4_4_ = pipeOut;
  input_local = input;
  this_local = this;
  while( true ) {
    for (; in_stack_00000010 != (Disposer *)0x0;
        in_stack_00000010 = (Disposer *)((long)in_stack_00000010 - (long)_auStack_38)) {
      f.exception = (Exception *)auStack_38;
      local_3c = kj::_::Debug::
                 syscall<kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_>
                           ((anon_class_24_3_7c53c502 *)&f,true);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_3c);
        kj::_::Debug::Fault::Fault
                  (&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b0,iVar2,
                   "n = splice(pipeIn, nullptr, fd, nullptr, MAX_SPLICE_LEN, SPLICE_F_MOVE | SPLICE_F_NONBLOCK)"
                   ,"");
        kj::_::Debug::Fault::fatal(&local_60);
      }
      if ((long)_auStack_38 < 1) {
        local_d8 = (PromiseFulfiller<void> *)
                   kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_38);
        f_2.exception._4_4_ = 0;
        kj::_::DebugExpression<long&>::operator<
                  ((DebugComparison<long_&,_int> *)local_d0,(DebugExpression<long&> *)&local_d8,
                   (int *)((long)&f_2.exception + 4));
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[49],unsigned_long&>
                    ((Fault *)(local_f0 + 8),
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1b5,FAILED,"n < 0",
                     "_kjCondition,\"splice pipe empty before bufferedAmount reached?\", bufferedAmount"
                     ,(DebugComparison<long_&,_int> *)local_d0,
                     (char (*) [49])"splice pipe empty before bufferedAmount reached?",
                     (unsigned_long *)&stack0x00000010);
          kj::_::Debug::Fault::fatal((Fault *)(local_f0 + 8));
        }
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_f0);
        _kjCondition_2._32_8_ = input;
        Promise<void>::
        then<kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_>
                  ((Promise<void> *)this,(Type *)local_f0);
        Promise<void>::~Promise((Promise<void> *)local_f0);
        return (PromiseBase)(PromiseBase)this;
      }
      f_1.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_38);
      kj::_::DebugExpression<long&>::operator<=
                ((DebugComparison<long_&,_unsigned_long_&> *)local_98,(DebugExpression<long&> *)&f_1
                 ,(unsigned_long *)&stack0x00000010);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long&>&,char_const(&)[40]>
                  ((Fault *)&_kjCondition_1.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b2,FAILED,"n <= bufferedAmount",
                   "_kjCondition,\"splice pipe larger than bufferedAmount?\"",
                   (DebugComparison<long_&,_unsigned_long_&> *)local_98,
                   (char (*) [40])"splice pipe larger than bufferedAmount?");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
      }
    }
    if (bufferedAmount <= (ulong)n) {
      f_3.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&n);
      kj::_::DebugExpression<unsigned_long&>::operator==
                ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_148,
                 (DebugExpression<unsigned_long&> *)&f_3,&bufferedAmount);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
      if (bVar1) {
        Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,n);
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                ((Fault *)&n_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x1c1,FAILED,"readSoFar == limit","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_148);
      kj::_::Debug::Fault::fatal((Fault *)&n_1);
    }
    f_4.exception = (Exception *)auStack_160;
    local_164 = kj::_::Debug::
                syscall<kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_3_>
                          ((anon_class_40_5_d105751c *)&f_4,true);
    pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_164);
    if (pvVar3 == (void *)0x0) break;
    if (_auStack_160 == (Disposer *)0x0) {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,n);
      return (PromiseBase)(PromiseBase)this;
    }
    if ((long)_auStack_160 < 0) {
      UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_1a0);
      Promise<void>::
      then<kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_4_>
                ((Promise<void> *)this,(Type *)local_1a0);
      Promise<void>::~Promise((Promise<void> *)local_1a0);
      return (PromiseBase)(PromiseBase)this;
    }
    n = (long)&_auStack_160->_vptr_Disposer + n;
    in_stack_00000010 = _auStack_160;
  }
  iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_164);
  kj::_::Debug::Fault::Fault
            ((Fault *)(local_1a0 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x1c7,iVar2,
             "n = splice(input.fd, nullptr, pipeOut, nullptr, kj::min(limit - readSoFar, MAX_SPLICE_LEN), SPLICE_F_MOVE | SPLICE_F_NONBLOCK)"
             ,"");
  kj::_::Debug::Fault::fatal((Fault *)(local_1a0 + 8));
}

Assistant:

Promise<uint64_t> splicePumpLoop(AsyncStreamFd& input, int pipeIn, int pipeOut,
                                   uint64_t readSoFar, uint64_t limit, size_t bufferedAmount) {
    for (;;) {
      while (bufferedAmount > 0) {
        // First flush out whatever is in the pipe buffer.
        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(pipeIn, nullptr, fd, nullptr,
            MAX_SPLICE_LEN, SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n > 0) {
          KJ_ASSERT(n <= bufferedAmount, "splice pipe larger than bufferedAmount?");
          bufferedAmount -= n;
        } else {
          KJ_ASSERT(n < 0, "splice pipe empty before bufferedAmount reached?", bufferedAmount);
          return observer.whenBecomesWritable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount);
          });
        }
      }

      // Now the pipe buffer is empty, so we can try to read some more.
      {
        if (readSoFar >= limit) {
          // Hit the limit, we're done.
          KJ_ASSERT(readSoFar == limit);
          return readSoFar;
        }

        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(input.fd, nullptr, pipeOut, nullptr,
            kj::min(limit - readSoFar, MAX_SPLICE_LEN), SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n == 0) {
          // EOF.
          return readSoFar;
        } else if (n < 0) {
          // No data available, wait.
          return input.observer.whenBecomesReadable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, 0);
          });
        }

        readSoFar += n;
        bufferedAmount = n;
      }
    }
  }